

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Token * __thiscall
jsonnet::internal::anon_unknown_0::Parser::pop(Token *__return_storage_ptr__,Parser *this)

{
  Token::Token(__return_storage_ptr__,
               (Token *)((this->tokens->
                         super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                         )._M_impl._M_node.super__List_node_base._M_next + 1));
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::_M_erase
            (this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
  return __return_storage_ptr__;
}

Assistant:

Token pop(void)
    {
        Token tok = peek();
        tokens.pop_front();
        return tok;
    }